

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O2

void aom_fft1d_32_float(float *input,float *output,int stride)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  
  fVar47 = *input + input[stride << 4];
  fVar57 = *input - input[stride << 4];
  fVar28 = input[stride * 8] + input[stride * 0x18];
  fVar1 = input[stride * 8] - input[stride * 0x18];
  fVar51 = fVar47 + fVar28;
  fVar47 = fVar47 - fVar28;
  fVar37 = input[stride * 4] + input[stride * 0x14];
  fVar28 = input[stride * 4] - input[stride * 0x14];
  fVar29 = input[stride * 0xc] + input[stride * 0x1c];
  fVar9 = input[stride * 0xc] - input[stride * 0x1c];
  fVar35 = fVar37 + fVar29;
  fVar37 = fVar37 - fVar29;
  fVar30 = fVar51 + fVar35;
  fVar51 = fVar51 - fVar35;
  fVar29 = (fVar28 - fVar9) * 0.707107;
  fVar4 = fVar57 + fVar29;
  fVar57 = fVar57 - fVar29;
  fVar28 = (fVar9 + fVar28) * 0.707107;
  fVar5 = (0.0 - fVar1) - fVar28;
  fVar1 = fVar1 - fVar28;
  fVar28 = input[stride * 2] + input[stride * 0x12];
  fVar55 = input[stride * 2] - input[stride * 0x12];
  fVar9 = input[stride * 10] + input[stride * 0x1a];
  fVar53 = input[stride * 10] - input[stride * 0x1a];
  fVar16 = fVar28 + fVar9;
  fVar28 = fVar28 - fVar9;
  fVar31 = input[stride * 6] + input[stride * 0x16];
  fVar19 = input[stride * 6] - input[stride * 0x16];
  fVar29 = input[stride * 0xe] + input[stride * 0x1e];
  fVar9 = input[stride * 0xe] - input[stride * 0x1e];
  fVar35 = fVar31 + fVar29;
  fVar31 = fVar31 - fVar29;
  fVar29 = fVar16 + fVar35;
  fVar16 = fVar16 - fVar35;
  fVar10 = input[stride] + input[stride * 0x11];
  fVar6 = input[stride] - input[stride * 0x11];
  fVar11 = input[stride * 9] + input[stride * 0x19];
  fVar7 = input[stride * 9] - input[stride * 0x19];
  fVar48 = input[stride * 5] + input[stride * 0x15];
  fVar35 = input[stride * 5] - input[stride * 0x15];
  fVar38 = input[stride * 0xd] + input[stride * 0x1d];
  fVar45 = input[stride * 0xd] - input[stride * 0x1d];
  fVar54 = input[stride * 3] + input[stride * 0x13];
  fVar12 = input[stride * 3] - input[stride * 0x13];
  fVar17 = input[stride * 0xb] + input[stride * 0x1b];
  fVar2 = input[stride * 0xb] - input[stride * 0x1b];
  fVar32 = input[stride * 7] + input[stride * 0x17];
  fVar8 = input[stride * 7] - input[stride * 0x17];
  fVar3 = input[stride * 0xf] + input[stride * 0x1f];
  fVar42 = input[stride * 0xf] - input[stride * 0x1f];
  fVar20 = (fVar8 - fVar42) * 0.707107;
  fVar13 = fVar12 + fVar20;
  fVar43 = (fVar42 + fVar8) * 0.707107;
  fVar21 = (0.0 - fVar2) - fVar43;
  fVar22 = fVar21 * 0.92388 - fVar13 * 0.382683;
  fVar14 = fVar30 + fVar29;
  fVar23 = fVar10 + fVar11;
  fVar49 = fVar48 + fVar38;
  fVar24 = fVar23 + fVar49;
  fVar42 = fVar54 + fVar17;
  fVar33 = fVar32 + fVar3;
  fVar15 = fVar42 + fVar33;
  fVar25 = fVar24 + fVar15;
  *output = fVar14 + fVar25;
  fVar8 = (fVar19 - fVar9) * 0.707107;
  fVar56 = fVar55 + fVar8;
  fVar36 = (fVar9 + fVar19) * 0.707107;
  fVar50 = (0.0 - fVar53) - fVar36;
  fVar19 = fVar56 * 0.92388;
  fVar34 = fVar50 * 0.382683;
  fVar18 = fVar19 + fVar34 + fVar4;
  fVar52 = (fVar35 - fVar45) * 0.707107;
  fVar9 = fVar6 + fVar52;
  fVar46 = (fVar45 + fVar35) * 0.707107;
  fVar45 = (0.0 - fVar7) - fVar46;
  fVar13 = fVar13 * 0.92388;
  fVar21 = fVar21 * 0.382683;
  fVar26 = fVar13 + fVar21 + fVar9;
  fVar39 = fVar45 + fVar22;
  fVar27 = fVar26 * 0.980785;
  fVar40 = fVar39 * 0.19509;
  output[stride] = fVar27 + fVar40 + fVar18;
  fVar55 = fVar55 - fVar8;
  fVar53 = fVar53 - fVar36;
  fVar10 = fVar10 - fVar11;
  fVar48 = fVar48 - fVar38;
  fVar54 = fVar54 - fVar17;
  fVar32 = fVar32 - fVar3;
  fVar35 = (fVar28 - fVar31) * 0.707107;
  fVar36 = fVar47 + fVar35;
  fVar44 = (fVar54 - fVar32) * 0.707107;
  fVar38 = fVar10 + fVar44;
  fVar41 = (fVar32 + fVar54) * 0.707107;
  fVar32 = (0.0 - fVar48) - fVar41;
  fVar8 = fVar38 * 0.92388;
  fVar54 = fVar32 * 0.382683;
  output[stride * 2] = fVar8 + fVar54 + fVar36;
  fVar3 = fVar50 * 0.92388 - fVar56 * 0.382683;
  fVar11 = fVar53 * 0.382683 - fVar55 * 0.92388;
  fVar55 = fVar55 * 0.382683;
  fVar53 = fVar53 * 0.92388;
  fVar50 = fVar55 + fVar53 + fVar57;
  fVar57 = ((0.0 - fVar55) - fVar53) + fVar57;
  fVar53 = fVar1 + fVar11;
  fVar11 = (0.0 - fVar1) + fVar11;
  fVar47 = fVar47 - fVar35;
  fVar28 = (fVar31 + fVar28) * 0.707107;
  fVar1 = (0.0 - fVar37) - fVar28;
  fVar37 = fVar37 - fVar28;
  fVar6 = fVar6 - fVar52;
  fVar7 = fVar7 - fVar46;
  fVar12 = fVar12 - fVar20;
  fVar2 = fVar2 - fVar43;
  fVar17 = fVar2 * 0.382683 - fVar12 * 0.92388;
  fVar12 = fVar12 * 0.382683;
  fVar2 = fVar2 * 0.92388;
  fVar43 = fVar12 + fVar2 + fVar6;
  fVar20 = fVar7 + fVar17;
  fVar28 = fVar43 * 0.83147;
  fVar31 = fVar20 * 0.55557;
  output[stride * 3] = fVar28 + fVar31 + fVar50;
  fVar23 = fVar23 - fVar49;
  fVar42 = fVar42 - fVar33;
  fVar55 = (fVar23 - fVar42) * 0.707107;
  output[stride * 4] = fVar51 + fVar55;
  fVar6 = ((0.0 - fVar12) - fVar2) + fVar6;
  fVar17 = (0.0 - fVar7) + fVar17;
  fVar33 = fVar6 * 0.55557;
  fVar2 = fVar17 * 0.83147;
  output[stride * 5] = fVar2 + fVar33 + fVar57;
  fVar4 = ((0.0 - fVar19) - fVar34) + fVar4;
  fVar19 = fVar5 + fVar3;
  fVar3 = (0.0 - fVar5) + fVar3;
  fVar10 = fVar10 - fVar44;
  fVar48 = fVar48 - fVar41;
  fVar5 = fVar10 * 0.382683;
  fVar12 = fVar48 * 0.92388;
  output[stride * 6] = fVar5 + fVar12 + fVar47;
  fVar9 = ((0.0 - fVar13) - fVar21) + fVar9;
  fVar22 = (0.0 - fVar45) + fVar22;
  fVar7 = fVar9 * 0.19509;
  fVar35 = fVar22 * 0.980785;
  output[stride * 7] = fVar35 + fVar7 + fVar4;
  output[stride * 8] = fVar30 - fVar29;
  output[stride * 9] = ((0.0 - fVar7) - fVar35) + fVar4;
  output[stride * 10] = ((0.0 - fVar5) - fVar12) + fVar47;
  output[stride * 0xb] = ((0.0 - fVar33) - fVar2) + fVar57;
  output[stride * 0xc] = fVar51 - fVar55;
  output[stride * 0xd] = ((0.0 - fVar28) - fVar31) + fVar50;
  output[stride * 0xe] = ((0.0 - fVar8) - fVar54) + fVar36;
  output[stride * 0xf] = ((0.0 - fVar27) - fVar40) + fVar18;
  output[stride << 4] = fVar14 - fVar25;
  fVar2 = fVar39 * 0.980785 - fVar26 * 0.19509;
  output[stride * 0x11] = fVar19 + fVar2;
  fVar4 = fVar32 * 0.92388 - fVar38 * 0.382683;
  output[stride * 0x12] = fVar1 + fVar4;
  fVar8 = fVar20 * 0.83147 - fVar43 * 0.55557;
  output[stride * 0x13] = fVar53 + fVar8;
  fVar29 = (fVar42 + fVar23) * 0.707107;
  output[stride * 0x14] = (0.0 - fVar16) - fVar29;
  fVar28 = fVar17 * 0.55557 - fVar6 * 0.83147;
  output[stride * 0x15] = fVar11 + fVar28;
  fVar35 = fVar48 * 0.382683 - fVar10 * 0.92388;
  output[stride * 0x16] = fVar37 + fVar35;
  fVar9 = fVar22 * 0.19509 - fVar9 * 0.980785;
  output[stride * 0x17] = fVar3 + fVar9;
  output[stride * 0x18] = (fVar15 - fVar24) + 0.0;
  output[stride * 0x19] = (0.0 - fVar3) + fVar9;
  output[stride * 0x1a] = (0.0 - fVar37) + fVar35;
  output[stride * 0x1b] = (0.0 - fVar11) + fVar28;
  output[stride * 0x1c] = fVar16 - fVar29;
  output[stride * 0x1d] = (0.0 - fVar53) + fVar8;
  output[stride * 0x1e] = (0.0 - fVar1) + fVar4;
  output[stride * 0x1f] = (0.0 - fVar19) + fVar2;
  return;
}

Assistant:

void aom_fft2x2_float_c(const float *input, float *temp, float *output) {
  aom_fft_2d_gen(input, temp, output, 2, aom_fft1d_2_float, simple_transpose,
                 unpack_2d_output, 1);
}